

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall.c
# Opt level: O0

void * metacallt_class(void *cls,char *name,metacall_value_id ret,void **args,size_t size)

{
  void **args_00;
  method argc;
  klass in_RCX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  method in_R8;
  method m;
  type_id *ids;
  type_id *in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  type_id ret_00;
  char *in_stack_ffffffffffffffb8;
  klass in_stack_ffffffffffffffc0;
  value local_8;
  
  ret_00 = (type_id)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  args_00 = (void **)metacall_type_ids(&in_stack_ffffffffffffffc0->name,
                                       (size_t)in_stack_ffffffffffffffb8);
  argc = class_static_method(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,ret_00,
                             in_stack_ffffffffffffffa8,0x139dad);
  if (args_00 != (void **)0x0) {
    free(args_00);
  }
  if (argc == (method)0x0) {
    log_write_impl_va("metacall",0x8b2,"metacallt_class",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/metacall/source/metacall.c"
                      ,LOG_LEVEL_ERROR,
                      "Method %s in class <%p> is not implemented with the parameter types being received"
                      ,in_RSI,in_RDI);
    local_8 = (value)0x0;
  }
  else {
    local_8 = class_static_call(in_RCX,in_R8,args_00,(size_t)argc);
  }
  return local_8;
}

Assistant:

void *metacallt_class(void *cls, const char *name, const enum metacall_value_id ret, void *args[], size_t size)
{
	type_id *ids = metacall_type_ids(args, size);

	method m = class_static_method(cls, name, ret, ids, size);

	if (ids != NULL)
	{
		free(ids);
	}

	if (m == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Method %s in class <%p> is not implemented with the parameter types being received", name, cls);
		return NULL;
	}

	return class_static_call(cls, m, args, size);
}